

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmTargetSelectLinker::Choose_abi_cxx11_(string *__return_storage_ptr__,cmTargetSelectLinker *this)

{
  size_t sVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  cmake *this_00;
  undefined1 local_1d8 [16];
  string local_1c8;
  ostringstream e;
  
  sVar1 = (this->Preferred)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (sVar1 != 1) {
    if (sVar1 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)&e);
      return __return_storage_ptr__;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar2 = std::operator<<((ostream *)&e,"Target ");
    poVar2 = std::operator<<(poVar2,(string *)&this->Target->Target->Name);
    poVar2 = std::operator<<(poVar2,
                             " contains multiple languages with the highest linker preference");
    poVar2 = std::operator<<(poVar2," (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->Preference);
    std::operator<<(poVar2,"):\n");
    for (p_Var3 = (this->Preferred)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->Preferred)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      poVar2 = std::operator<<((ostream *)&e,"  ");
      poVar2 = std::operator<<(poVar2,(string *)(p_Var3 + 1));
      std::operator<<(poVar2,"\n");
    }
    std::operator<<((ostream *)&e,"Set the LINKER_LANGUAGE property for this target.");
    this_00 = cmLocalGenerator::GetCMakeInstance(this->Target->LocalGenerator);
    std::__cxx11::stringbuf::str();
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_1d8);
    cmake::IssueMessage(this_00,FATAL_ERROR,(string *)(local_1d8 + 0x10),
                        (cmListFileBacktrace *)local_1d8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d8 + 8));
    std::__cxx11::string::~string((string *)(local_1d8 + 0x10));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  }
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)((this->Preferred)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1))
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string Choose()
  {
    if (this->Preferred.empty()) {
      return "";
    }
    if (this->Preferred.size() > 1) {
      std::ostringstream e;
      e << "Target " << this->Target->GetName()
        << " contains multiple languages with the highest linker preference"
        << " (" << this->Preference << "):\n";
      for (std::string const& li : this->Preferred) {
        e << "  " << li << "\n";
      }
      e << "Set the LINKER_LANGUAGE property for this target.";
      cmake* cm = this->Target->GetLocalGenerator()->GetCMakeInstance();
      cm->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                       this->Target->GetBacktrace());
    }
    return *this->Preferred.begin();
  }